

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.h
# Opt level: O0

void __thiscall
FIX::ScreenLog::ScreenLog
          (ScreenLog *this,SessionID *sessionID,bool incoming,bool outgoing,bool event)

{
  bool event_local;
  bool outgoing_local;
  bool incoming_local;
  SessionID *sessionID_local;
  ScreenLog *this_local;
  
  Log::Log(&this->super_Log);
  (this->super_Log)._vptr_Log = (_func_int **)&PTR__ScreenLog_0030c308;
  SessionID::toString_abi_cxx11_(&this->m_prefix,sessionID);
  UtcTimeStamp::UtcTimeStamp(&this->m_time);
  this->m_incoming = incoming;
  this->m_outgoing = outgoing;
  this->m_event = event;
  return;
}

Assistant:

ScreenLog( const SessionID& sessionID,
             bool incoming, bool outgoing, bool event )
: m_prefix( sessionID.toString() ),
  m_incoming( incoming ), m_outgoing( outgoing ), m_event( event ) {}